

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_tests.cpp
# Opt level: O0

void skiwi::format_test_7(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  allocator<char> local_411;
  string local_410 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  allocator<char> local_3c9;
  string local_3c8 [32];
  string local_3a8 [32];
  anon_unknown_0 local_388 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  allocator<char> local_341;
  string local_340 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  allocator<char> local_2f9;
  string local_2f8 [32];
  string local_2d8 [32];
  anon_unknown_0 local_2b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  allocator<char> local_271;
  string local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  allocator<char> local_229;
  string local_228 [32];
  string local_208 [32];
  anon_unknown_0 local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  allocator<char> local_1a1;
  string local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  allocator<char> local_159;
  string local_158 [32];
  string local_138 [32];
  anon_unknown_0 local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_d1;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator<char> local_79;
  string local_78 [32];
  string local_58 [32];
  anon_unknown_0 local_38 [8];
  string res;
  format_options ops;
  
  skiwi::format_options::format_options((format_options *)(res.field_2._M_local_buf + 0xc));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "(define newton lambda(guess function derivative epsilon) (define guess2 (- guess (/ (function guess) (derivative guess)))) (if (< (abs(- guess guess2)) epsilon) guess2 (newton guess2 function derivative epsilon)))"
             ,&local_79);
  skiwi::format(local_58,(format_options *)local_78);
  anon_unknown_0::cleanup(local_38,(EVP_PKEY_CTX *)local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,
             "\n(define newton lambda\n  (guess function derivative epsilon)\n  (define guess2\n    (- guess\n      (/ (function guess)\n         (derivative guess))))\n  (if (< (abs\n           (- guess guess2))\n         epsilon)\n      guess2\n      (newton guess2 function derivative epsilon)))\n"
             ,&local_d1);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_b0,(EVP_PKEY_CTX *)local_d0);
  std::__cxx11::string::string((string *)&local_f8,(string *)local_38);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_b0,&local_f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xe6,"void skiwi::format_test_7()");
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"(case (car \'(c d)) [(a) \'a] [(b) \'b])",&local_159);
  skiwi::format(local_138,(format_options *)local_158);
  anon_unknown_0::cleanup(local_118,(EVP_PKEY_CTX *)local_138);
  std::__cxx11::string::operator=((string *)local_38,(string *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,
             "\n(case (car\n        \'(c d))\n        [(a)\n         \'a]\n        [(b)\n         \'b])\n"
             ,&local_1a1);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_180,(EVP_PKEY_CTX *)local_1a0);
  std::__cxx11::string::string((string *)&local_1c8,(string *)local_38);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_180,&local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xf0,"void skiwi::format_test_7()");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_228,"(string #\\j #\\a #\\n #\\n #\\e #\\m #\\a #\\n)",&local_229);
  skiwi::format(local_208,(format_options *)local_228);
  anon_unknown_0::cleanup(local_1e8,(EVP_PKEY_CTX *)local_208);
  std::__cxx11::string::operator=((string *)local_38,(string *)local_1e8);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_270,"\n(string #\\j #\\a #\\n #\\n #\\e #\\m #\\a #\\n)\n",&local_271);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_250,(EVP_PKEY_CTX *)local_270);
  std::__cxx11::string::string((string *)&local_298,(string *)local_38);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_250,&local_298,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xf5,"void skiwi::format_test_7()");
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f8,"quote (\"Hello\" \"World\")",&local_2f9);
  skiwi::format(local_2d8,(format_options *)local_2f8);
  anon_unknown_0::cleanup(local_2b8,(EVP_PKEY_CTX *)local_2d8);
  std::__cxx11::string::operator=((string *)local_38,(string *)local_2b8);
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_340,"\nquote (\"Hello\" \"World\")\n",&local_341);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_320,(EVP_PKEY_CTX *)local_340);
  std::__cxx11::string::string((string *)&local_368,(string *)local_38);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_320,&local_368,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0xfa,"void skiwi::format_test_7()");
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator(&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c8,
             "(letrec([f (lambda(i)  (when (<= i 100000) (let([x (list 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0)]) (f(add1 i)))))]) (f 0) 100)"
             ,&local_3c9);
  skiwi::format(local_3a8,(format_options *)local_3c8);
  anon_unknown_0::cleanup(local_388,(EVP_PKEY_CTX *)local_3a8);
  std::__cxx11::string::operator=((string *)local_38,(string *)local_388);
  std::__cxx11::string::~string((string *)local_388);
  std::__cxx11::string::~string(local_3a8);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_410,
             "\n(letrec ([f (lambda\n              (i)\n              (when\n                (<= i 100000)\n                (let\n                  ([x (list 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0)])\n                  (f (add1 i)))))])\n        (f 0)\n        100)\n"
             ,&local_411);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_3f0,(EVP_PKEY_CTX *)local_410);
  std::__cxx11::string::string((string *)&local_438,(string *)local_38);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_3f0,&local_438,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0x107,"void skiwi::format_test_7()");
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator(&local_411);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void format_test_7()
  {
  format_options ops;
  ops.max_width = 10;
  auto res = cleanup(format("(define newton lambda(guess function derivative epsilon) (define guess2 (- guess (/ (function guess) (derivative guess)))) (if (< (abs(- guess guess2)) epsilon) guess2 (newton guess2 function derivative epsilon)))", ops));
  TEST_EQ(cleanup(R"(
(define newton lambda
  (guess function derivative epsilon)
  (define guess2
    (- guess
      (/ (function guess)
         (derivative guess))))
  (if (< (abs
           (- guess guess2))
         epsilon)
      guess2
      (newton guess2 function derivative epsilon)))
)"), res);

  res = cleanup(format("(case (car '(c d)) [(a) 'a] [(b) 'b])", ops));
  TEST_EQ(cleanup(R"(
(case (car
        '(c d))
        [(a)
         'a]
        [(b)
         'b])
)"), res);

  res = cleanup(format(R"((string #\j #\a #\n #\n #\e #\m #\a #\n))", ops));
  TEST_EQ(cleanup(R"(
(string #\j #\a #\n #\n #\e #\m #\a #\n)
)"), res);

  res = cleanup(format("quote (\"Hello\" \"World\")", ops));
  TEST_EQ(cleanup(R"(
quote ("Hello" "World")
)"), res);

  res = cleanup(format("(letrec([f (lambda(i)  (when (<= i 100000) (let([x (list 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0)]) (f(add1 i)))))]) (f 0) 100)", ops));
  TEST_EQ(cleanup(R"(
(letrec ([f (lambda
              (i)
              (when
                (<= i 100000)
                (let
                  ([x (list 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0 0)])
                  (f (add1 i)))))])
        (f 0)
        100)
)"), res);
  }